

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_EarlyCallbackVersionSwitch_Test::TestBody
          (SSLTest_EarlyCallbackVersionSwitch_Test *this)

{
  bool bVar1;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  _func_ssl_select_cert_result_t_SSL_CLIENT_HELLO_ptr *cb;
  pointer server_ctx_00;
  SSL *ssl;
  char *in_R9;
  AssertHelper local_230;
  Message local_228;
  int local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1e8;
  Message local_1e0;
  ClientConfig local_1d8;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_70;
  AssertHelper local_50;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_20;
  UniquePtr<SSL_CTX> client_ctx;
  UniquePtr<SSL_CTX> server_ctx;
  SSLTest_EarlyCallbackVersionSwitch_Test *this_local;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&client_ctx,method);
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&local_20,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_40,&client_ctx,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_40,(AssertionResult *)"server_ctx","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1016,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_48);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,&local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,
                 (AssertionResult *)"client_ctx","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1017,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
      local_cc = SSL_CTX_set_max_proto_version(psVar2,0x304);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_c8,&local_cc,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_c8,
                   (AssertionResult *)"SSL_CTX_set_max_proto_version(client_ctx.get(), 0x0304)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1018,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&client_ctx);
        local_114 = SSL_CTX_set_max_proto_version(psVar2,0x304);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_148,(internal *)local_110,
                     (AssertionResult *)"SSL_CTX_set_max_proto_version(server_ctx.get(), 0x0304)",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1019,pcVar3);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&client_ctx);
          cb = (anonymous_namespace)::SSLTest_EarlyCallbackVersionSwitch_Test::TestBody()::$_0::
               operator_cast_to_function_pointer
                         ((__0 *)((long)&client._M_t.
                                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t
                                         .super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 7));
          SSL_CTX_set_select_certificate_cb(psVar2,cb);
          std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
          std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__4.message_);
          psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
          server_ctx_00 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&client_ctx);
          local_1d8.verify_hostname.field_2._M_allocated_capacity = 0;
          local_1d8.verify_hostname.field_2._8_8_ = 0;
          local_1d8.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
          local_1d8.verify_hostname._1_7_ = 0;
          local_1d8.verify_hostname._M_string_length = 0;
          local_1d8.servername.field_2._M_allocated_capacity = 0;
          local_1d8.servername.field_2._8_8_ = 0;
          local_1d8.servername._M_dataplus = (_Alloc_hider)0x0;
          local_1d8.servername._1_7_ = 0;
          local_1d8.servername._M_string_length = 0;
          local_1d8.session = (SSL_SESSION *)0x0;
          local_1d8.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
          local_1d8.hostflags = 0;
          local_1d8.early_data = false;
          local_1d8._85_3_ = 0;
          ClientConfig::ClientConfig(&local_1d8);
          pcVar3 = (char *)0x1;
          local_171 = ConnectClientAndServer
                                (&server,(UniquePtr<SSL> *)&gtest_ar__4.message_,psVar2,
                                 server_ctx_00,&local_1d8,true);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_170,&local_171,(type *)0x0);
          ClientConfig::~ClientConfig(&local_1d8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar1) {
            testing::Message::Message(&local_1e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_170,
                       (AssertionResult *)
                       "ConnectClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                       ,"false","true",pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1027,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
            testing::internal::AssertHelper::~AssertHelper(&local_1e8);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_1e0);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_220[1] = 0x303;
            ssl = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
            local_220[0] = SSL_version(ssl);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_218,"0x0303","SSL_version(client.get())",local_220 + 1,
                       local_220);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
            if (!bVar1) {
              testing::Message::Message(&local_228);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
              testing::internal::AssertHelper::AssertHelper
                        (&local_230,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1028,pcVar3);
              testing::internal::AssertHelper::operator=(&local_230,&local_228);
              testing::internal::AssertHelper::~AssertHelper(&local_230);
              testing::Message::~Message(&local_228);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
        }
      }
    }
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
  return;
}

Assistant:

TEST(SSLTest, EarlyCallbackVersionSwitch) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(client_ctx);
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(client_ctx.get(), TLS1_3_VERSION));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(server_ctx.get(), TLS1_3_VERSION));

  SSL_CTX_set_select_certificate_cb(
      server_ctx.get(),
      [](const SSL_CLIENT_HELLO *client_hello) -> ssl_select_cert_result_t {
        if (!SSL_set_max_proto_version(client_hello->ssl, TLS1_2_VERSION)) {
          return ssl_select_cert_error;
        }

        return ssl_select_cert_success;
      });

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx.get(),
                                     server_ctx.get()));
  EXPECT_EQ(TLS1_2_VERSION, SSL_version(client.get()));
}